

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O3

XXH_INLINE_XXH128_hash_t
XXH128_mix32B(XXH_INLINE_XXH128_hash_t acc,xxh_u8 *input_1,xxh_u8 *input_2,xxh_u8 *secret,
             XXH64_hash_t seed)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  xxh_u64 input_lo;
  XXH_INLINE_XXH128_hash_t XVar5;
  long *in_stack_00000008;
  long in_stack_00000010;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = in_stack_00000008[1] - in_stack_00000010 ^ (ulong)input_2;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *in_stack_00000008 + in_stack_00000010 ^ (ulong)input_1;
  XVar5.low64 = (ulong)(secret + seed) ^
                (SUB168(auVar1 * auVar3,8) ^ SUB168(auVar1 * auVar3,0)) + acc.low64;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_stack_00000008[3] - in_stack_00000010 ^ seed;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = in_stack_00000010 + in_stack_00000008[2] ^ (ulong)secret;
  XVar5.high64 = (ulong)(input_1 + (long)input_2) ^
                 (SUB168(auVar2 * auVar4,8) ^ SUB168(auVar2 * auVar4,0)) + acc.high64;
  return XVar5;
}

Assistant:

XXH_FORCE_INLINE XXH128_hash_t
XXH128_mix32B(XXH128_hash_t acc, const xxh_u8* input_1, const xxh_u8* input_2, const xxh_u8* secret, XXH64_hash_t seed)
{
    acc.low64  += XXH3_mix16B (input_1, secret+0, seed);
    acc.low64  ^= XXH_readLE64(input_2) + XXH_readLE64(input_2 + 8);
    acc.high64 += XXH3_mix16B (input_2, secret+16, seed);
    acc.high64 ^= XXH_readLE64(input_1) + XXH_readLE64(input_1 + 8);
    return acc;
}